

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR DSK_deletefile(LispPTR *args)

{
  uint uVar1;
  FileName *varray;
  int iVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  size_t sVar6;
  int *piVar7;
  long lVar8;
  DLword *pDVar9;
  int local_403c;
  char ver [16];
  char fbuf [4096];
  char file [4096];
  char vless [4096];
  char dir [4096];
  long lVar5;
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
    pLVar4 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar4 + 6) == 'D') {
      iVar2 = pLVar4[2] * 2 + 5;
    }
    else {
      if (*(char *)((long)pLVar4 + 6) != 'C') {
        error("LispStringLength: Not a character array.\n");
        goto LAB_00119a42;
      }
      iVar2 = pLVar4[2] + 3;
    }
    if (iVar2 < 0x1001) {
LAB_00119a42:
      pLVar4 = NativeAligned4FromLAddr(*args);
      LVar3 = 0x1000;
      if ((int)pLVar4[2] < 0x1000) {
        LVar3 = pLVar4[2];
      }
      lVar5 = (long)(int)LVar3;
      if (*(char *)((long)pLVar4 + 6) == 'D') {
        pDVar9 = Lisp_world + (ulong)(ushort)pLVar4[1] + (ulong)(*pLVar4 & 0xfffffff);
        for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
          fbuf[lVar8] = *(char *)((ulong)pDVar9 ^ 2);
          pDVar9 = pDVar9 + 1;
        }
        fbuf[lVar8] = '\0';
      }
      else if (*(char *)((long)pLVar4 + 6) == 'C') {
        uVar1 = *pLVar4;
        LVar3 = pLVar4[1];
        for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
          fbuf[lVar8] = *(char *)((long)Lisp_world +
                                  lVar8 + (ulong)(ushort)LVar3 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3)
          ;
        }
        fbuf[lVar5] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      unixpathname(fbuf,file,1,0);
      iVar2 = unpack_filename(file,dir,fbuf,ver,1);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = get_version_array(dir,fbuf);
      varray = VA.files;
      if (iVar2 == 0) {
        return 0;
      }
      if ((VA.files)->version_no == 0xffffffff) {
        return 0;
      }
      strcpy(file,fbuf);
      if (ver[0] != '\0') {
        sVar6 = strlen(file);
        (file + sVar6)[0] = '.';
        (file + sVar6)[1] = '~';
        file[sVar6 + 2] = '\0';
        strcat(file,ver);
        sVar6 = strlen(file);
        (file + sVar6)[0] = '~';
        (file + sVar6)[1] = '\0';
      }
      iVar2 = get_oldest(dir,varray,file,fbuf);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = get_versionless(VA.files,vless,dir);
      if (iVar2 == 0) {
        alarm(TIMEOUT_TIME);
        piVar7 = __errno_location();
        do {
          *piVar7 = 0;
          iVar2 = unlink(file);
          if (iVar2 != -1) goto LAB_00119d48;
        } while (*piVar7 == 4);
      }
      else {
        iVar2 = check_vless_link(vless,VA.files,fbuf,&local_403c);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = strcmp(file,vless);
        if ((iVar2 == 0) || (iVar2 = strcmp(file,fbuf), iVar2 == 0)) {
          alarm(TIMEOUT_TIME);
          piVar7 = __errno_location();
          if (fbuf[0] == '\0') {
            do {
              *piVar7 = 0;
              iVar2 = unlink(vless);
              if (iVar2 != -1) goto LAB_00119d48;
            } while (*piVar7 == 4);
          }
          else {
            do {
              *piVar7 = 0;
              iVar2 = unlink(vless);
              if (iVar2 != -1) {
                alarm(0);
                alarm(TIMEOUT_TIME);
                do {
                  *piVar7 = 0;
                  iVar2 = unlink(fbuf);
                  if (iVar2 != -1) {
                    alarm(0);
                    iVar2 = maintain_version(vless,0);
                    if (iVar2 != 0) {
                      return 0x4c;
                    }
                    return 0;
                  }
                } while (*piVar7 == 4);
                break;
              }
            } while (*piVar7 == 4);
          }
        }
        else {
          alarm(TIMEOUT_TIME);
          piVar7 = __errno_location();
          do {
            *piVar7 = 0;
            iVar2 = unlink(file);
            if (iVar2 != -1) {
LAB_00119d48:
              alarm(0);
              return 0x4c;
            }
          } while (*piVar7 == 4);
        }
      }
      alarm(0);
      *Lisp_errno = *piVar7;
      return 0;
    }
    *Lisp_errno = 200;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR DSK_deletefile(LispPTR *args)
{
  char file[MAXPATHLEN], fbuf[MAXPATHLEN], vless[MAXPATHLEN];
  char dir[MAXPATHLEN], ver[VERSIONLEN];
  int rval, fatp;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive);
  unixpathname(fbuf, file, 1, 0, drive, &extlen, rawname);
#else
  unixpathname(fbuf, file, 1, 0);
#endif

  if (unpack_filename(file, dir, fbuf, ver, 1) == 0) return (NIL);
  if (get_version_array(dir, fbuf) == 0) return (NIL);

  if (NoFileP(VA.files))
    return (NIL); /*
                   * If the specified file is deleted from
                   * outside of Lisp during the last time
                   * Lisp recognize it and now, this case
                   * will occur.
                   */

  /*
   * Although the file should have been recognized with "oldest" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */

  ConcNameAndVersion(fbuf, ver, file);
  if (get_oldest(dir, VA.files, file, fbuf) == 0) return (NIL);

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is no versionless file.  All we have to do is to simply
     * try to unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }

  /*
   * If a versionless file exists, we have to check the link status of it,
   * because deleting a versionless file or a file to which a versionless
   * file is linked will destroy the consistency of the version status.
   */

  if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) return (NIL);

  if (strcmp(file, vless) == 0 || strcmp(file, fbuf) == 0) {
    if (*fbuf != '\0') {
      /*
       * Both of the versionless file and the file to which the
       * versionless file is linked have to be unlinked.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      TIMEOUT(rval = unlink(fbuf));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      /*
       * Finally, we have to maintain the version status.
       */
      if (maintain_version(vless, 0) == 0) return (NIL);
      return (ATOM_T);
    } else {
      /*
       * Although the versionfile is specified, it is not linked
       * to any file in VA.files.  We should not maintain the version
       * status after deleting the versionless file, because
       * we cannot say whether the versionless file is actually under
       * control of the Medley DSK file system or not.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);
    }
  } else {
    /*
     * Just unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }
}